

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStandardAttributes.cpp
# Opt level: O3

void testStandardAttributes(string *tempDir)

{
  float *pfVar1;
  pointer pcVar2;
  undefined1 auVar3 [16];
  Vec2<float> VVar4;
  char cVar5;
  ushort uVar6;
  int i;
  int iVar7;
  undefined4 uVar8;
  ostream *poVar9;
  long lVar10;
  Header *pHVar11;
  float *pfVar12;
  Vec2 *pVVar13;
  void *pvVar14;
  Vec3 *pVVar15;
  Box *pBVar16;
  int *piVar17;
  undefined8 uVar18;
  ulong extraout_RAX;
  int x_1;
  int face_1;
  uint uVar19;
  long lVar20;
  int x;
  long lVar21;
  uint uVar22;
  int x_2;
  int iVar23;
  float fVar24;
  float fVar35;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar36;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  float fVar37;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  _Alloc_hider _Var63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  float fVar68;
  float fVar71;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  string filename;
  RgbaOutputFile out;
  half hStack_4ce;
  float fStack_4cc;
  int local_4c4;
  Chromaticities c;
  float fStack_4ac;
  float local_4a8;
  float local_4a4;
  float local_4a0;
  float fStack_49c;
  float local_498;
  float local_494;
  V2f pos;
  Rational r9;
  CubeMapFace face;
  float fStack_464;
  char *local_460;
  M44f M2;
  Rand48 rand_1;
  undefined2 uStack_40a;
  Rand48 rand;
  undefined2 uStack_3fa;
  CubeMapFace face_2;
  float fStack_3ec;
  void *local_3e8;
  undefined8 uStack_3e0;
  V2f pos_2;
  Vec3<float> local_3b8;
  V2f pif;
  Vec2<float> local_398;
  Vec2<float> local_390;
  float local_388 [2];
  undefined8 uStack_380;
  float *local_378;
  char *local_370;
  M44f M1;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar58 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing optional standard attributes",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"conversion from RGB to XYZ",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  M1.x[0][0] = 0.64;
  M1.x[0][1] = 0.33;
  M2.x[0][0] = 0.3;
  M2.x[0][1] = 0.6;
  filename._M_dataplus._M_p = (pointer)0x3d75c28f3e19999a;
  _out = 0x1a37;
  hStack_4ce._h = 0x3ea0;
  fStack_4cc._0_2_ = 0x72b0;
  fStack_4cc._2_2_ = 0x3ea8;
  Imf_3_2::Chromaticities::Chromaticities(&c,(Vec2 *)&M1,(Vec2 *)&M2,(Vec2 *)&filename,(Vec2 *)&out)
  ;
  Imf_3_2::RGBtoXYZ((Chromaticities *)&M1,100.0);
  local_3e8 = (void *)CONCAT44(local_3e8._4_4_,M1.x[1][3]);
  fVar67 = M1.x[0][3] + M1.x[1][3] * 0.0 + M1.x[2][3] * 0.0 + M1.x[3][3];
  filename._M_string_length._0_4_ =
       (M1.x[0][2] + M1.x[1][2] * 0.0 + M1.x[2][2] * 0.0 + M1.x[3][2]) / fVar67;
  fVar35 = M1.x[1][0];
  fVar68 = M1.x[1][1];
  local_388[0] = M1.x[1][0];
  local_388[1] = M1.x[1][1];
  uStack_380 = 0;
  fVar54 = M1.x[0][0];
  fVar36 = M1.x[0][1];
  fVar24 = M1.x[2][0];
  fVar37 = M1.x[2][1];
  fVar71 = M1.x[3][0];
  auVar69._0_4_ = fVar54 + fVar35 * 0.0 + fVar24 * 0.0 + fVar71;
  fVar72 = M1.x[3][1];
  auVar69._4_4_ = fVar36 + fVar68 * 0.0 + fVar37 * 0.0 + fVar72;
  auVar69._8_8_ = 0;
  auVar70._4_4_ = fVar67;
  auVar70._0_4_ = fVar67;
  auVar70._8_8_ = 0;
  auVar70 = divps(auVar69,auVar70);
  filename._M_dataplus._M_p = auVar70._0_8_;
  fVar67 = M1.x[0][3] * 0.0 + M1.x[1][3] + M1.x[2][3] * 0.0 + M1.x[3][3];
  fVar74 = (M1.x[0][2] * 0.0 + M1.x[1][2] + M1.x[2][2] * 0.0 + M1.x[3][2]) / fVar67;
  auVar62._0_4_ = fVar54 * 0.0 + fVar35 + fVar24 * 0.0 + fVar71;
  auVar62._4_4_ = fVar36 * 0.0 + fVar68 + fVar37 * 0.0 + fVar72;
  auVar62._8_8_ = 0;
  auVar3._4_4_ = fVar67;
  auVar3._0_4_ = fVar67;
  auVar3._8_8_ = 0;
  auVar70 = divps(auVar62,auVar3);
  _out = auVar70._0_8_;
  auVar64._0_4_ = M1.x[0][3] * 0.0 + M1.x[1][3] * 0.0 + M1.x[2][3] + M1.x[3][3];
  fVar67 = (M1.x[0][2] * 0.0 + M1.x[1][2] * 0.0 + M1.x[2][2] + M1.x[3][2]) / auVar64._0_4_;
  auVar80._0_4_ = fVar54 * 0.0 + fVar35 * 0.0 + fVar24 + fVar71;
  auVar80._4_4_ = fVar36 * 0.0 + fVar68 * 0.0 + fVar37 + fVar72;
  auVar80._8_8_ = 0;
  auVar64._4_4_ = auVar64._0_4_;
  auVar64._8_8_ = 0;
  auVar70 = divps(auVar80,auVar64);
  r9 = auVar70._0_8_;
  auVar38._0_4_ = M1.x[0][3] + M1.x[1][3] + M1.x[2][3] + M1.x[3][3];
  auVar25._0_4_ = fVar54 + fVar35 + fVar24 + fVar71;
  auVar25._4_4_ = fVar36 + fVar68 + fVar37 + fVar72;
  auVar25._8_8_ = 0;
  fVar54 = (M1.x[0][2] + M1.x[1][2] + M1.x[2][2] + M1.x[3][2]) / auVar38._0_4_;
  auVar38._4_4_ = auVar38._0_4_;
  auVar38._8_8_ = 0;
  auVar70 = divps(auVar25,auVar38);
  pos = auVar70._0_8_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"red   XYZ = ",0xc);
  poVar9 = Imath_3_2::operator<<((ostream *)&std::cout,(Vec3<float> *)&filename);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"green XYZ = ",0xc);
  poVar9 = Imath_3_2::operator<<((ostream *)&std::cout,(Vec3<float> *)&out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"blue  XYZ = ",0xc);
  poVar9 = Imath_3_2::operator<<((ostream *)&std::cout,(Vec3<float> *)&r9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"white XYZ = ",0xc);
  poVar9 = Imath_3_2::operator<<((ostream *)&std::cout,(Vec3<float> *)&pos);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  auVar26._8_8_ = 0;
  auVar26._0_8_ = filename._M_dataplus._M_p;
  fVar37 = (float)((ulong)filename._M_dataplus._M_p >> 0x20);
  auVar39._4_4_ = fVar37;
  auVar39._0_4_ = fVar37;
  auVar39._8_4_ = fVar37;
  auVar39._12_4_ = fVar37;
  auVar40._4_12_ = auVar39._4_12_;
  auVar40._0_4_ = fVar37 + SUB84(filename._M_dataplus._M_p,0) + (float)filename._M_string_length;
  auVar42._0_8_ = auVar40._0_8_;
  auVar42._8_4_ = fVar37;
  auVar42._12_4_ = fVar37;
  auVar41._8_8_ = auVar42._8_8_;
  auVar41._4_4_ = auVar40._0_4_;
  auVar41._0_4_ = auVar40._0_4_;
  auVar70 = divps(auVar26,auVar41);
  _face = auVar70._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_2_ = _out;
  auVar27._2_2_ = hStack_4ce._h;
  auVar27._4_2_ = fStack_4cc._0_2_;
  auVar27._6_2_ = fStack_4cc._2_2_;
  fVar37 = out._4_4_;
  auVar43._4_4_ = fVar37;
  auVar43._0_4_ = fVar37;
  auVar43._8_4_ = fVar37;
  auVar43._12_4_ = fVar37;
  auVar44._4_12_ = auVar43._4_12_;
  auVar44._0_4_ = fVar37 + out._0_4_ + fVar74;
  auVar46._0_8_ = auVar44._0_8_;
  auVar46._8_4_ = fVar37;
  auVar46._12_4_ = fVar37;
  auVar45._8_8_ = auVar46._8_8_;
  auVar45._4_4_ = auVar44._0_4_;
  auVar45._0_4_ = auVar44._0_4_;
  auVar70 = divps(auVar27,auVar45);
  _face_2 = auVar70._0_8_;
  auVar28._8_8_ = 0;
  auVar28._0_4_ = r9.n;
  auVar28._4_4_ = r9.d;
  fVar37 = (float)r9.d;
  auVar47._4_4_ = fVar37;
  auVar47._0_4_ = fVar37;
  auVar47._8_4_ = fVar37;
  auVar47._12_4_ = fVar37;
  auVar48._4_12_ = auVar47._4_12_;
  auVar48._0_4_ = fVar37 + (float)r9.n + fVar67;
  auVar50._0_8_ = auVar48._0_8_;
  auVar50._8_4_ = fVar37;
  auVar50._12_4_ = fVar37;
  auVar49._8_8_ = auVar50._8_8_;
  auVar49._4_4_ = auVar48._0_4_;
  auVar49._0_4_ = auVar48._0_4_;
  auVar70 = divps(auVar28,auVar49);
  auVar51._8_8_ = 0;
  auVar51._0_4_ = pos.x;
  auVar51._4_4_ = pos.y;
  fVar37 = pos.y;
  auVar55._4_4_ = fVar37;
  auVar55._0_4_ = fVar37;
  auVar55._8_4_ = fVar37;
  auVar55._12_4_ = fVar37;
  auVar56._4_12_ = auVar55._4_12_;
  auVar56._0_4_ = fVar37 + pos.x + fVar54;
  local_390 = auVar70._0_8_;
  auVar58._0_8_ = auVar56._0_8_;
  auVar58._8_4_ = fVar37;
  auVar58._12_4_ = fVar37;
  auVar57._8_8_ = auVar58._8_8_;
  auVar57._4_4_ = auVar56._0_4_;
  auVar57._0_4_ = auVar56._0_4_;
  auVar70 = divps(auVar51,auVar57);
  local_398 = auVar70._0_8_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"red   xy = ",0xb);
  poVar9 = Imath_3_2::operator<<((ostream *)&std::cout,(Vec2<float> *)&face);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"green xy = ",0xb);
  poVar9 = Imath_3_2::operator<<((ostream *)&std::cout,(Vec2<float> *)&face_2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"blue  xy = ",0xb);
  poVar9 = Imath_3_2::operator<<((ostream *)&std::cout,&local_390);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"white xy = ",0xb);
  poVar9 = Imath_3_2::operator<<((ostream *)&std::cout,&local_398);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  fVar37 = pos.y;
  if (pos.y <= -pos.y) {
    fVar37 = -pos.y;
  }
  if (fVar37 * 1e-05 <
      (float)(-(uint)(100.0 < pos.y) & (uint)(pos.y + -100.0) |
             ~-(uint)(100.0 < pos.y) & (uint)(100.0 - pos.y))) {
    __assert_fail("equalWithRelError (W1.y, Y, 1e-5F)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x38,"void (anonymous namespace)::convertRGBtoXYZ()");
  }
  if ((float)(~-(uint)(_c < (float)face) & (uint)(_c - (float)face) |
             (uint)((float)face - _c) & -(uint)(_c < (float)face)) <= 1e-05) {
    if ((float)(~-(uint)(fStack_4ac < fStack_464) & (uint)(fStack_4ac - fStack_464) |
               (uint)(fStack_464 - fStack_4ac) & -(uint)(fStack_4ac < fStack_464)) <= 1e-05) {
      if ((1e-05 < (float)(~-(uint)(local_4a8 < (float)face_2) & (uint)(local_4a8 - (float)face_2) |
                          (uint)((float)face_2 - local_4a8) & -(uint)(local_4a8 < (float)face_2)))
         || (1e-05 < (float)(~-(uint)(local_4a4 < fStack_3ec) & (uint)(local_4a4 - fStack_3ec) |
                            (uint)(fStack_3ec - local_4a4) & -(uint)(local_4a4 < fStack_3ec)))) {
        __assert_fail("g1.equalWithAbsError (c.green, 1e-5F)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                      ,0x3a,"void (anonymous namespace)::convertRGBtoXYZ()");
      }
      if ((1e-05 < (float)(~-(uint)(local_4a0 < local_390.x) & (uint)(local_4a0 - local_390.x) |
                          (uint)(local_390.x - local_4a0) & -(uint)(local_4a0 < local_390.x))) ||
         (1e-05 < (float)(~-(uint)(fStack_49c < local_390.y) & (uint)(fStack_49c - local_390.y) |
                         (uint)(local_390.y - fStack_49c) & -(uint)(fStack_49c < local_390.y)))) {
        __assert_fail("b1.equalWithAbsError (c.blue, 1e-5F)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                      ,0x3b,"void (anonymous namespace)::convertRGBtoXYZ()");
      }
      if ((1e-05 < (float)(~-(uint)(local_498 < local_398.x) & (uint)(local_498 - local_398.x) |
                          (uint)(local_398.x - local_498) & -(uint)(local_498 < local_398.x))) ||
         (1e-05 < (float)(~-(uint)(local_494 < local_398.y) & (uint)(local_494 - local_398.y) |
                         (uint)(local_398.y - local_494) & -(uint)(local_494 < local_398.y)))) {
        __assert_fail("w1.equalWithAbsError (c.white, 1e-5F)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                      ,0x3c,"void (anonymous namespace)::convertRGBtoXYZ()");
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"conversion from XYZ to RGB",0x1a);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      Imf_3_2::XYZtoRGB((Chromaticities *)&M2,100.0);
      auVar78._0_4_ =
           (float)filename._M_string_length * M2.x[2][3] +
           filename._M_dataplus._M_p._0_4_ * M2.x[0][3] +
           filename._M_dataplus._M_p._4_4_ * M2.x[1][3] + M2.x[3][3];
      local_388[0] = M2.x[0][0];
      local_388[1] = M2.x[0][1];
      uStack_380 = 0;
      fVar68 = M2.x[1][0];
      fVar71 = M2.x[1][1];
      fVar37 = M2.x[0][0];
      fVar24 = M2.x[0][1];
      fVar36 = M2.x[2][0];
      fVar35 = M2.x[2][1];
      fVar72 = M2.x[3][0];
      auVar75._0_4_ =
           (float)filename._M_string_length * fVar36 +
           filename._M_dataplus._M_p._0_4_ * fVar37 + filename._M_dataplus._M_p._4_4_ * fVar68 +
           fVar72;
      fVar73 = M2.x[3][1];
      auVar75._4_4_ =
           (float)filename._M_string_length * fVar35 +
           filename._M_dataplus._M_p._0_4_ * fVar24 + filename._M_dataplus._M_p._4_4_ * fVar71 +
           fVar73;
      auVar75._8_4_ =
           filename._M_dataplus._M_p._0_4_ * 0.0 + filename._M_dataplus._M_p._4_4_ * 0.0 + 0.0 + 0.0
      ;
      auVar75._12_4_ =
           filename._M_dataplus._M_p._0_4_ * 0.0 + filename._M_dataplus._M_p._4_4_ * 0.0 + 0.0 + 0.0
      ;
      auVar78._4_4_ = auVar78._0_4_;
      auVar78._8_8_ = 0;
      auVar70 = divps(auVar75,auVar78);
      _rand = auVar70._0_8_;
      local_460 = (char *)CONCAT44(local_460._4_4_,M2.x[1][3]);
      local_3e8 = (void *)M2.x[1]._0_8_;
      uStack_3e0 = 0;
      auVar76._0_4_ = fVar74 * M2.x[2][3] + _out * M2.x[0][3] + M2.x[1][3] * fStack_4cc + M2.x[3][3]
      ;
      auVar79._0_4_ = fVar74 * fVar36 + _out * fVar37 + fStack_4cc * fVar68 + fVar72;
      auVar79._4_4_ = fVar74 * fVar35 + _out * fVar24 + fStack_4cc * fVar71 + fVar73;
      auVar79._8_4_ = _out * 0.0 + fStack_4cc * 0.0 + 0.0 + 0.0;
      auVar79._12_4_ = _out * 0.0 + fStack_4cc * 0.0 + 0.0 + 0.0;
      auVar76._4_4_ = auVar76._0_4_;
      auVar76._8_8_ = 0;
      auVar70 = divps(auVar79,auVar76);
      pif = auVar70._0_8_;
      auVar29._0_4_ =
           fVar67 * M2.x[2][3] + (float)r9.n * M2.x[0][3] + M2.x[1][3] * (float)r9.d + M2.x[3][3];
      auVar77._0_4_ = fVar67 * fVar36 + (float)r9.n * fVar37 + (float)r9.d * fVar68 + fVar72;
      auVar77._4_4_ = fVar67 * fVar35 + (float)r9.n * fVar24 + (float)r9.d * fVar71 + fVar73;
      auVar77._8_4_ = (float)r9.n * 0.0 + (float)r9.d * 0.0 + 0.0 + 0.0;
      auVar77._12_4_ = (float)r9.n * 0.0 + (float)r9.d * 0.0 + 0.0 + 0.0;
      auVar29._4_4_ = auVar29._0_4_;
      auVar29._8_8_ = 0;
      auVar70 = divps(auVar77,auVar29);
      pos_2 = auVar70._0_8_;
      auVar59._0_4_ = M2.x[2][3] * fVar54 + M2.x[0][3] * pos.x + M2.x[1][3] * pos.y + M2.x[3][3];
      auVar65._0_4_ = fVar54 * fVar36 + pos.x * fVar37 + pos.y * fVar68 + fVar72;
      auVar65._4_4_ = fVar54 * fVar35 + pos.x * fVar24 + pos.y * fVar71 + fVar73;
      auVar65._8_4_ = pos.x * 0.0 + pos.y * 0.0 + 0.0 + 0.0;
      auVar65._12_4_ = pos.x * 0.0 + pos.y * 0.0 + 0.0 + 0.0;
      local_3b8.z = (M2.x[2][2] * fVar54 + M2.x[0][2] * pos.x + M2.x[1][2] * pos.y + M2.x[3][2]) /
                    auVar59._0_4_;
      auVar59._4_4_ = auVar59._0_4_;
      auVar59._8_8_ = 0;
      auVar70 = divps(auVar65,auVar59);
      local_3b8._0_8_ = auVar70._0_8_;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"red   RGB = ",0xc);
      poVar9 = Imath_3_2::operator<<((ostream *)&std::cout,(Vec3<float> *)&rand);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"green RGB = ",0xc);
      poVar9 = Imath_3_2::operator<<((ostream *)&std::cout,(Vec3<float> *)&pif);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"blue  RGB = ",0xc);
      poVar9 = Imath_3_2::operator<<((ostream *)&std::cout,(Vec3<float> *)&pos_2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"white RGB = ",0xc);
      poVar9 = Imath_3_2::operator<<((ostream *)&std::cout,&local_3b8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      _rand_1 = 0x3f800000;
      if ((float)(-(uint)(1.0 < (float)rand._state._0_4_) & (uint)((float)rand._state._0_4_ + -1.0)
                 | ~-(uint)(1.0 < (float)rand._state._0_4_) & (uint)(1.0 - (float)rand._state._0_4_)
                 ) <= 0.001) {
        lVar10 = 1;
        do {
          lVar20 = lVar10;
          if (lVar20 == 3) goto LAB_001a3e1d;
          fVar37 = *(float *)(rand._state + lVar20 * 2);
          fVar54 = *(float *)(rand_1._state + lVar20 * 2);
          lVar10 = lVar20 + 1;
        } while ((float)(~-(uint)(fVar54 < fVar37) & (uint)(fVar54 - fVar37) |
                        (uint)(fVar37 - fVar54) & -(uint)(fVar54 < fVar37)) <= 0.001);
        if (1 < lVar20 - 1U) {
LAB_001a3e1d:
          _rand_1 = 0x3f80000000000000;
          if (ABS(pif.x) <= 0.001) {
            lVar10 = 1;
            do {
              lVar20 = lVar10;
              if (lVar20 == 3) goto LAB_001a3ea1;
              fVar37 = (&pif.x)[lVar20];
              fVar54 = *(float *)(rand_1._state + lVar20 * 2);
              lVar10 = lVar20 + 1;
            } while ((float)(~-(uint)(fVar54 < fVar37) & (uint)(fVar54 - fVar37) |
                            (uint)(fVar37 - fVar54) & -(uint)(fVar54 < fVar37)) <= 0.001);
            if (1 < lVar20 - 1U) {
LAB_001a3ea1:
              _rand_1 = 0;
              if (ABS(pos_2.x) <= 0.001) {
                lVar10 = 1;
                do {
                  lVar20 = lVar10;
                  if (lVar20 == 3) goto LAB_001a3f20;
                  fVar37 = (&pos_2.x)[lVar20];
                  fVar54 = *(float *)(rand_1._state + lVar20 * 2);
                  lVar10 = lVar20 + 1;
                } while ((float)(~-(uint)(fVar54 < fVar37) & (uint)(fVar54 - fVar37) |
                                (uint)(fVar37 - fVar54) & -(uint)(fVar54 < fVar37)) <= 0.001);
                if (1 < lVar20 - 1U) {
LAB_001a3f20:
                  _rand_1 = 0x3f8000003f800000;
                  if ((float)(-(uint)(1.0 < local_3b8.x) & (uint)(local_3b8.x + -1.0) |
                             ~-(uint)(1.0 < local_3b8.x) & (uint)(1.0 - local_3b8.x)) <= 0.001) {
                    lVar10 = 1;
                    do {
                      lVar20 = lVar10;
                      if (lVar20 == 3) goto LAB_001a3fc1;
                      fVar37 = (&local_3b8.x)[lVar20];
                      fVar54 = *(float *)(rand_1._state + lVar20 * 2);
                      lVar10 = lVar20 + 1;
                    } while ((float)(~-(uint)(fVar54 < fVar37) & (uint)(fVar54 - fVar37) |
                                    (uint)(fVar37 - fVar54) & -(uint)(fVar54 < fVar37)) <= 0.001);
                    if (1 < lVar20 - 1U) {
LAB_001a3fc1:
                      pcVar2 = (tempDir->_M_dataplus)._M_p;
                      filename._M_dataplus._M_p = (pointer)&filename.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&filename,pcVar2,pcVar2 + tempDir->_M_string_length);
                      std::__cxx11::string::append((char *)&filename);
                      _Var63 = filename._M_dataplus;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"chromaticities attribute",0x18);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
                      std::ostream::put('X');
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"writing, ",9);
                      M1.x[0][0] = 1.0;
                      M1.x[0][1] = 2.0;
                      M2.x[0][0] = 3.0;
                      M2.x[0][1] = 4.0;
                      _out = 0;
                      hStack_4ce._h = 0x40a0;
                      fStack_4cc._0_2_ = 0;
                      fStack_4cc._2_2_ = 0x40c0;
                      r9.n = 0x40e00000;
                      r9.d = 0x41000000;
                      Imf_3_2::Chromaticities::Chromaticities
                                (&c,(Vec2 *)&M1,(Vec2 *)&M2,(Vec2 *)&out,(Vec2 *)&r9);
                      M1.x[0][0] = 0.0;
                      M1.x[0][1] = 0.0;
                      Imf_3_2::Header::Header
                                ((Header *)&M2,100,100,1.0,(Vec2 *)&M1,1.0,INCREASING_Y,
                                 ZIP_COMPRESSION);
                      cVar5 = Imf_3_2::hasChromaticities((Header *)&M2);
                      if (cVar5 != '\0') {
                        __assert_fail("hasChromaticities (header) == false",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                      ,0x5e,
                                      "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                     );
                      }
                      Imf_3_2::addChromaticities((Header *)&M2,&c);
                      cVar5 = Imf_3_2::hasChromaticities((Header *)&M2);
                      if (cVar5 == '\0') {
                        __assert_fail("hasChromaticities (header) == true",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                      ,0x61,
                                      "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                     );
                      }
                      iVar7 = Imf_3_2::globalThreadCount();
                      Imf_3_2::RgbaOutputFile::RgbaOutputFile
                                (&out,_Var63._M_p,(Header *)&M2,WRITE_RGBA,iVar7);
                      lVar10 = 0;
                      do {
                        pfVar12 = M1.x[0] + lVar10 * 2;
                        pfVar12[0] = 0.007826805;
                        pfVar12[1] = 0.007826805;
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 100);
                      Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)&M1,1);
                      Imf_3_2::RgbaOutputFile::writePixels((int)&out);
                      Imf_3_2::RgbaOutputFile::~RgbaOutputFile(&out);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"reading, comparing",0x12);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
                      std::ostream::put('X');
                      std::ostream::flush();
                      iVar7 = Imf_3_2::globalThreadCount();
                      Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&M1,_Var63._M_p,iVar7);
                      pHVar11 = (Header *)Imf_3_2::RgbaInputFile::header();
                      pfVar12 = (float *)Imf_3_2::chromaticities(pHVar11);
                      pHVar11 = (Header *)Imf_3_2::RgbaInputFile::header();
                      cVar5 = Imf_3_2::hasChromaticities(pHVar11);
                      if (cVar5 == '\0') {
                        __assert_fail("hasChromaticities (in.header ()) == true",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                      ,0x79,
                                      "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                     );
                      }
                      if ((_c == *pfVar12) && (!NAN(_c) && !NAN(*pfVar12))) {
                        if ((fStack_4ac == pfVar12[1]) && (!NAN(fStack_4ac) && !NAN(pfVar12[1]))) {
                          if ((((local_4a8 != pfVar12[2]) || (NAN(local_4a8) || NAN(pfVar12[2]))) ||
                              (local_4a4 != pfVar12[3])) || (NAN(local_4a4) || NAN(pfVar12[3]))) {
                            __assert_fail("c1.green == c2.green",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x7b,
                                          "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                         );
                          }
                          if (((local_4a0 != pfVar12[4]) || (NAN(local_4a0) || NAN(pfVar12[4]))) ||
                             ((fStack_49c != pfVar12[5] || (NAN(fStack_49c) || NAN(pfVar12[5]))))) {
                            __assert_fail("c1.blue == c2.blue",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x7c,
                                          "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                         );
                          }
                          if (((local_498 != pfVar12[6]) || (NAN(local_498) || NAN(pfVar12[6]))) ||
                             ((local_494 != pfVar12[7] || (NAN(local_494) || NAN(pfVar12[7]))))) {
                            __assert_fail("c1.white == c2.white",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x7d,
                                          "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                         );
                          }
                          Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&M1);
                          remove(_Var63._M_p);
                          Imf_3_2::Header::~Header((Header *)&M2);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)filename._M_dataplus._M_p != &filename.field_2) {
                            operator_delete(filename._M_dataplus._M_p,
                                            filename.field_2._M_allocated_capacity + 1);
                          }
                          M2.x[0]._0_8_ = M2.x + 1;
                          pcVar2 = (tempDir->_M_dataplus)._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&M2,pcVar2,pcVar2 + tempDir->_M_string_length);
                          std::__cxx11::string::append((char *)&M2);
                          _c = &local_4a0;
                          pcVar2 = (tempDir->_M_dataplus)._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&c,pcVar2,pcVar2 + tempDir->_M_string_length);
                          std::__cxx11::string::append((char *)&c);
                          pfVar12 = _c;
                          local_460 = (char *)M2.x[0]._0_8_;
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"latitude-longitude environment map",0x22
                                    );
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
                          std::ostream::put('X');
                          std::ostream::flush();
                          filename._M_dataplus._M_p = (pointer)0x0;
                          Imf_3_2::Header::Header
                                    ((Header *)&M1,0x168,0xb4,1.0,(Vec2 *)&filename,1.0,INCREASING_Y
                                     ,ZIP_COMPRESSION);
                          filename._M_dataplus._M_p = filename._M_dataplus._M_p & 0xffffffff00000000
                          ;
                          Imf_3_2::addEnvmap((Header *)&M1,(Envmap *)&filename);
                          filename._M_dataplus._M_p = (pointer)0x3f80000000000000;
                          filename._M_string_length._0_4_ = 0.0;
                          Imf_3_2::LatLongMap::latLong((Vec3 *)&out);
                          if (1e-06 < (float)(-(uint)(1.5707964 < _out) & (uint)(_out + -1.5707964)
                                             | ~-(uint)(1.5707964 < _out) & (uint)(1.5707964 - _out)
                                             )) {
                            __assert_fail("equalWithAbsError (pos.x, float (M_PI / 2), 1e-6f)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x90,
                                          "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                         );
                          }
                          filename._M_dataplus._M_p = (pointer)0xbf80000000000000;
                          filename._M_string_length._0_4_ = 0.0;
                          Imf_3_2::LatLongMap::latLong((Vec3 *)&out);
                          if (1e-06 < (float)(-(uint)(-1.5707964 < _out) & (uint)(_out + 1.5707964)
                                             | ~-(uint)(-1.5707964 < _out) &
                                               (uint)(-1.5707964 - _out))) {
                            __assert_fail("equalWithAbsError (pos.x, float (-M_PI / 2), 1e-6f)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x93,
                                          "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                         );
                          }
                          filename._M_dataplus._M_p = (pointer)0x0;
                          filename._M_string_length._0_4_ = 1.0;
                          uVar8 = Imf_3_2::LatLongMap::latLong((Vec3 *)&out);
                          iVar7 = -(uint)(1e-06 < ABS(out._0_4_));
                          iVar23 = -(uint)(1e-06 < ABS(out._4_4_));
                          auVar31._4_4_ = iVar23;
                          auVar31._0_4_ = iVar7;
                          auVar31._8_4_ = iVar23;
                          auVar31._12_4_ = iVar23;
                          auVar30._8_8_ = auVar31._8_8_;
                          auVar30._4_4_ = iVar7;
                          auVar30._0_4_ = iVar7;
                          iVar7 = movmskpd(uVar8,auVar30);
                          if (iVar7 != 0) {
                            __assert_fail("pos.equalWithAbsError (V2f (0, 0), 1e-6f)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x96,
                                          "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                         );
                          }
                          filename._M_dataplus._M_p = (pointer)0x3f800000;
                          filename._M_string_length._0_4_ = 0.0;
                          Imf_3_2::LatLongMap::latLong((Vec3 *)&out);
                          if ((1e-06 < ABS(_out)) ||
                             (1e-06 < (float)(-(uint)(1.5707964 < fStack_4cc) &
                                              (uint)(fStack_4cc + -1.5707964) |
                                             ~-(uint)(1.5707964 < fStack_4cc) &
                                             (uint)(1.5707964 - fStack_4cc)))) {
                            __assert_fail("pos.equalWithAbsError (V2f (0, M_PI / 2), 1e-6f)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x99,
                                          "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                         );
                          }
                          filename._M_dataplus._M_p = (pointer)0xbf800000;
                          filename._M_string_length._0_4_ = 0.0;
                          Imf_3_2::LatLongMap::latLong((Vec3 *)&out);
                          if ((1e-06 < ABS(_out)) ||
                             (1e-06 < (float)(-(uint)(-1.5707964 < fStack_4cc) &
                                              (uint)(fStack_4cc + 1.5707964) |
                                             ~-(uint)(-1.5707964 < fStack_4cc) &
                                             (uint)(-1.5707964 - fStack_4cc)))) {
                            __assert_fail("pos.equalWithAbsError (V2f (0, -M_PI / 2), 1e-6f)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x9c,
                                          "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                         );
                          }
                          filename._M_dataplus._M_p = (pointer)0x3f80000000000000;
                          filename._M_string_length._0_4_ = 1.0;
                          Imf_3_2::LatLongMap::latLong((Vec3 *)&out);
                          if ((1e-06 < (float)(-(uint)(0.7853982 < _out) & (uint)(_out + -0.7853982)
                                              | ~-(uint)(0.7853982 < _out) &
                                                (uint)(0.7853982 - _out))) ||
                             (1e-06 < ABS(fStack_4cc))) {
                            __assert_fail("pos.equalWithAbsError (V2f (M_PI / 4, 0), 1e-6f)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x9f,
                                          "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                         );
                          }
                          filename._M_dataplus._M_p = (pointer)0xbf80000000000000;
                          filename._M_string_length._0_4_ = 1.0;
                          Imf_3_2::LatLongMap::latLong((Vec3 *)&out);
                          if ((1e-06 < (float)(-(uint)(-0.7853982 < _out) & (uint)(_out + 0.7853982)
                                              | ~-(uint)(-0.7853982 < _out) &
                                                (uint)(-0.7853982 - _out))) ||
                             (1e-06 < ABS(fStack_4cc))) {
                            __assert_fail("pos.equalWithAbsError (V2f (-M_PI / 4, 0), 1e-6f)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0xa2,
                                          "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                         );
                          }
                          pVVar13 = (Vec2 *)Imf_3_2::Header::dataWindow();
                          _out = 0xfdb;
                          hStack_4ce._h = 0x3fc9;
                          fStack_4cc._0_2_ = 0xfdb;
                          fStack_4cc._2_2_ = 0x4049;
                          uVar8 = Imf_3_2::LatLongMap::pixelPosition((Box *)&filename,pVVar13);
                          iVar7 = -(uint)(0.00036 < ABS(SUB84(filename._M_dataplus._M_p,0)));
                          iVar23 = -(uint)(0.00036 <
                                          ABS((float)((ulong)filename._M_dataplus._M_p >> 0x20)));
                          auVar33._4_4_ = iVar23;
                          auVar33._0_4_ = iVar7;
                          auVar33._8_4_ = iVar23;
                          auVar33._12_4_ = iVar23;
                          auVar32._8_8_ = auVar33._8_8_;
                          auVar32._4_4_ = iVar7;
                          auVar32._0_4_ = iVar7;
                          iVar7 = movmskpd(uVar8,auVar32);
                          if (iVar7 != 0) {
                            __assert_fail("pos.equalWithAbsError (V2f (0, 0), 1e-6f * W)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0xa6,
                                          "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                         );
                          }
                          pVVar13 = (Vec2 *)Imf_3_2::Header::dataWindow();
                          _out = 0xfdb;
                          hStack_4ce._h = 0xbfc9;
                          fStack_4cc._0_2_ = 0xfdb;
                          fStack_4cc._2_2_ = 0xc049;
                          Imf_3_2::LatLongMap::pixelPosition((Box *)&filename,pVVar13);
                          fVar37 = filename._M_dataplus._M_p._0_4_;
                          fVar54 = filename._M_dataplus._M_p._4_4_;
                          lVar10 = Imf_3_2::Header::dataWindow();
                          fVar36 = (float)*(int *)(lVar10 + 8);
                          if ((0.00036 < (float)(~-(uint)(fVar36 < fVar37) & (uint)(fVar36 - fVar37)
                                                | (uint)(fVar37 - fVar36) & -(uint)(fVar36 < fVar37)
                                                )) ||
                             (fVar37 = (float)*(int *)(lVar10 + 0xc),
                             0.00036 < (float)(~-(uint)(fVar37 < fVar54) & (uint)(fVar37 - fVar54) |
                                              (uint)(fVar54 - fVar37) & -(uint)(fVar37 < fVar54))))
                          {
                            __assert_fail("pos.equalWithAbsError (V2f (header.dataWindow ().max), 1e-6f * W)"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0xaa,
                                          "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                         );
                          }
                          pvVar14 = operator_new__(0x7e900);
                          lVar10 = (long)pvVar14 + 4;
                          lVar20 = 0;
                          do {
                            lVar21 = 0;
                            do {
                              pVVar13 = (Vec2 *)Imf_3_2::Header::dataWindow();
                              fStack_4cc = (float)(int)lVar20;
                              _out = (float)(int)lVar21;
                              Imf_3_2::LatLongMap::direction((Box *)&filename,pVVar13);
                              fVar37 = ABS(filename._M_dataplus._M_p._0_4_ + 1.0);
                              uVar6 = (ushort)((uint)(filename._M_dataplus._M_p._0_4_ + 1.0) >> 0x10
                                              ) & 0x8000;
                              if ((uint)fVar37 < 0x38800000) {
                                if ((0x33000000 < (uint)fVar37) &&
                                   (uVar19 = (uint)fVar37 & 0x7fffff | 0x800000,
                                   cVar5 = (char)((uint)fVar37 >> 0x17),
                                   uVar6 = uVar6 | (ushort)(uVar19 >> (0x7eU - cVar5 & 0x1f)),
                                   0x80000000 < uVar19 << (cVar5 + 0xa2U & 0x1f))) {
                                  uVar6 = uVar6 + 1;
                                }
                              }
                              else if ((uint)fVar37 < 0x7f800000) {
                                if ((uint)fVar37 < 0x477ff000) {
                                  uVar6 = (ushort)((int)fVar37 + 0x8000fff +
                                                   (uint)(((uint)fVar37 >> 0xd & 1) != 0) >> 0xd) |
                                          uVar6;
                                }
                                else {
                                  uVar6 = uVar6 | 0x7c00;
                                }
                              }
                              else {
                                uVar6 = uVar6 | 0x7c00;
                                if (fVar37 != INFINITY) {
                                  uVar19 = (uint)fVar37 >> 0xd & 0x3ff;
                                  uVar6 = uVar6 | (ushort)uVar19 | (ushort)(uVar19 == 0);
                                }
                              }
                              *(ushort *)(lVar10 + -4 + lVar21 * 8) = uVar6;
                              fVar37 = ABS(filename._M_dataplus._M_p._4_4_ + 1.0);
                              uVar6 = (ushort)((uint)(filename._M_dataplus._M_p._4_4_ + 1.0) >> 0x10
                                              ) & 0x8000;
                              if ((uint)fVar37 < 0x38800000) {
                                if ((0x33000000 < (uint)fVar37) &&
                                   (uVar19 = (uint)fVar37 & 0x7fffff | 0x800000,
                                   cVar5 = (char)((uint)fVar37 >> 0x17),
                                   uVar6 = uVar6 | (ushort)(uVar19 >> (0x7eU - cVar5 & 0x1f)),
                                   0x80000000 < uVar19 << (cVar5 + 0xa2U & 0x1f))) {
                                  uVar6 = uVar6 + 1;
                                }
                              }
                              else if ((uint)fVar37 < 0x7f800000) {
                                if ((uint)fVar37 < 0x477ff000) {
                                  uVar6 = (ushort)((int)fVar37 + 0x8000fff +
                                                   (uint)(((uint)fVar37 >> 0xd & 1) != 0) >> 0xd) |
                                          uVar6;
                                }
                                else {
                                  uVar6 = uVar6 | 0x7c00;
                                }
                              }
                              else {
                                uVar6 = uVar6 | 0x7c00;
                                if (fVar37 != INFINITY) {
                                  uVar19 = (uint)fVar37 >> 0xd & 0x3ff;
                                  uVar6 = uVar6 | (ushort)uVar19 | (ushort)(uVar19 == 0);
                                }
                              }
                              *(ushort *)(lVar10 + -2 + lVar21 * 8) = uVar6;
                              fVar37 = ABS((float)filename._M_string_length + 1.0);
                              uVar6 = (ushort)((uint)((float)filename._M_string_length + 1.0) >>
                                              0x10) & 0x8000;
                              if ((uint)fVar37 < 0x38800000) {
                                if ((0x33000000 < (uint)fVar37) &&
                                   (uVar19 = (uint)fVar37 & 0x7fffff | 0x800000,
                                   cVar5 = (char)((uint)fVar37 >> 0x17),
                                   uVar6 = uVar6 | (ushort)(uVar19 >> (0x7eU - cVar5 & 0x1f)),
                                   0x80000000 < uVar19 << (cVar5 + 0xa2U & 0x1f))) {
                                  uVar6 = uVar6 + 1;
                                }
                              }
                              else if ((uint)fVar37 < 0x7f800000) {
                                if ((uint)fVar37 < 0x477ff000) {
                                  uVar6 = (ushort)((int)fVar37 + 0x8000fff +
                                                   (uint)(((uint)fVar37 >> 0xd & 1) != 0) >> 0xd) |
                                          uVar6;
                                }
                                else {
                                  uVar6 = uVar6 | 0x7c00;
                                }
                              }
                              else {
                                uVar6 = uVar6 | 0x7c00;
                                if (fVar37 != INFINITY) {
                                  uVar19 = (uint)fVar37 >> 0xd & 0x3ff;
                                  uVar6 = uVar6 | (ushort)uVar19 | (ushort)(uVar19 == 0);
                                }
                              }
                              *(ushort *)(lVar10 + lVar21 * 8) = uVar6;
                              lVar21 = lVar21 + 1;
                            } while (lVar21 != 0x168);
                            lVar20 = lVar20 + 1;
                            lVar10 = lVar10 + 0xb40;
                          } while (lVar20 != 0xb4);
                          iVar7 = Imf_3_2::globalThreadCount();
                          Imf_3_2::RgbaOutputFile::RgbaOutputFile
                                    ((RgbaOutputFile *)&filename,local_460,(Header *)&M1,WRITE_RGB,
                                     iVar7);
                          Imf_3_2::RgbaOutputFile::setFrameBuffer
                                    ((Rgba *)&filename,(ulong)pvVar14,1);
                          Imf_3_2::RgbaOutputFile::writePixels((int)&filename);
                          Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&filename);
                          rand._state[0] = 0x5a5a;
                          rand._state[1] = 0x5a5a;
                          rand._state[2] = 0x5a5a;
                          iVar7 = 0;
                          do {
                            Imath_3_2::hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
                                      ((Imath_3_2 *)&filename,&rand);
                            pVVar15 = (Vec3 *)Imf_3_2::Header::dataWindow();
                            Imf_3_2::LatLongMap::pixelPosition((Box *)&pos,pVVar15);
                            fVar37 = (filename._M_dataplus._M_p._0_4_ + 1.0) * 0.8;
                            fVar54 = ABS(fVar37);
                            uVar6 = (ushort)((uint)fVar37 >> 0x10) & 0x8000;
                            if ((uint)fVar54 < 0x38800000) {
                              if ((0x33000000 < (uint)fVar54) &&
                                 (uVar19 = (uint)fVar54 & 0x7fffff | 0x800000,
                                 cVar5 = (char)((uint)fVar54 >> 0x17),
                                 uVar6 = uVar6 | (ushort)(uVar19 >> (0x7eU - cVar5 & 0x1f)),
                                 0x80000000 < uVar19 << (cVar5 + 0xa2U & 0x1f))) {
                                uVar6 = uVar6 + 1;
                              }
                            }
                            else if ((uint)fVar54 < 0x7f800000) {
                              if ((uint)fVar54 < 0x477ff000) {
                                uVar6 = (ushort)((int)fVar54 + 0x8000fff +
                                                 (uint)(((uint)fVar54 >> 0xd & 1) != 0) >> 0xd) |
                                        uVar6;
                              }
                              else {
                                uVar6 = uVar6 | 0x7c00;
                              }
                            }
                            else {
                              uVar6 = uVar6 | 0x7c00;
                              if (fVar54 != INFINITY) {
                                uVar19 = (uint)fVar54 >> 0xd & 0x3ff;
                                uVar6 = uVar6 | (ushort)uVar19 | (ushort)(uVar19 == 0);
                              }
                            }
                            iVar23 = (int)(pos.y + 0.5);
                            lVar10 = (long)(int)(pos.x + 0.5);
                            *(ushort *)((long)pvVar14 + lVar10 * 8 + (long)iVar23 * 0xb40) = uVar6;
                            fVar37 = (filename._M_dataplus._M_p._4_4_ + 1.0) * 0.8;
                            fVar54 = ABS(fVar37);
                            uVar6 = (ushort)((uint)fVar37 >> 0x10) & 0x8000;
                            if ((uint)fVar54 < 0x38800000) {
                              if ((0x33000000 < (uint)fVar54) &&
                                 (uVar19 = (uint)fVar54 & 0x7fffff | 0x800000,
                                 cVar5 = (char)((uint)fVar54 >> 0x17),
                                 uVar6 = uVar6 | (ushort)(uVar19 >> (0x7eU - cVar5 & 0x1f)),
                                 0x80000000 < uVar19 << (cVar5 + 0xa2U & 0x1f))) {
                                uVar6 = uVar6 + 1;
                              }
                            }
                            else if ((uint)fVar54 < 0x7f800000) {
                              if ((uint)fVar54 < 0x477ff000) {
                                uVar6 = (ushort)((int)fVar54 + 0x8000fff +
                                                 (uint)(((uint)fVar54 >> 0xd & 1) != 0) >> 0xd) |
                                        uVar6;
                              }
                              else {
                                uVar6 = uVar6 | 0x7c00;
                              }
                            }
                            else {
                              uVar6 = uVar6 | 0x7c00;
                              if (fVar54 != INFINITY) {
                                uVar19 = (uint)fVar54 >> 0xd & 0x3ff;
                                uVar6 = uVar6 | (ushort)uVar19 | (ushort)(uVar19 == 0);
                              }
                            }
                            *(ushort *)((long)pvVar14 + lVar10 * 8 + (long)iVar23 * 0xb40 + 2) =
                                 uVar6;
                            fVar37 = ((float)filename._M_string_length + 1.0) * 0.8;
                            fVar54 = ABS(fVar37);
                            uVar6 = (ushort)((uint)fVar37 >> 0x10) & 0x8000;
                            if ((uint)fVar54 < 0x38800000) {
                              if ((0x33000000 < (uint)fVar54) &&
                                 (uVar19 = (uint)fVar54 & 0x7fffff | 0x800000,
                                 cVar5 = (char)((uint)fVar54 >> 0x17),
                                 uVar6 = uVar6 | (ushort)(uVar19 >> (0x7eU - cVar5 & 0x1f)),
                                 0x80000000 < uVar19 << (cVar5 + 0xa2U & 0x1f))) {
                                uVar6 = uVar6 + 1;
                              }
                            }
                            else if ((uint)fVar54 < 0x7f800000) {
                              if ((uint)fVar54 < 0x477ff000) {
                                uVar6 = (ushort)((int)fVar54 + 0x8000fff +
                                                 (uint)(((uint)fVar54 >> 0xd & 1) != 0) >> 0xd) |
                                        uVar6;
                              }
                              else {
                                uVar6 = uVar6 | 0x7c00;
                              }
                            }
                            else {
                              uVar6 = uVar6 | 0x7c00;
                              if (fVar54 != INFINITY) {
                                uVar19 = (uint)fVar54 >> 0xd & 0x3ff;
                                uVar6 = uVar6 | (ushort)uVar19 | (ushort)(uVar19 == 0);
                              }
                            }
                            *(ushort *)((long)pvVar14 + lVar10 * 8 + (long)iVar23 * 0xb40 + 4) =
                                 uVar6;
                            pVVar13 = (Vec2 *)Imf_3_2::Header::dataWindow();
                            Imf_3_2::LatLongMap::direction((Box *)&out,pVVar13);
                            fVar37 = fVar74 * fVar74 + _out * _out + fStack_4cc * fStack_4cc;
                            if (fVar37 < 2.3509887e-38) {
                              fVar37 = Imath_3_2::Vec3<float>::lengthTiny((Vec3<float> *)&out);
                            }
                            else {
                              fVar37 = SQRT(fVar37);
                            }
                            if ((fVar37 != 0.0) || (NAN(fVar37))) {
                              auVar52._8_8_ = 0;
                              auVar52._0_2_ = _out;
                              auVar52._2_2_ = hStack_4ce._h;
                              auVar52._4_2_ = fStack_4cc._0_2_;
                              auVar52._6_2_ = fStack_4cc._2_2_;
                              auVar60._4_4_ = fVar37;
                              auVar60._0_4_ = fVar37;
                              auVar60._8_4_ = fVar37;
                              auVar60._12_4_ = fVar37;
                              auVar70 = divps(auVar52,auVar60);
                              r9 = auVar70._0_8_;
                            }
                            else {
                              r9.n = 0;
                              r9.d = 0;
                            }
                            fVar37 = (float)r9.n;
                            if (1e-05 < (float)(~-(uint)(fVar37 < filename._M_dataplus._M_p._0_4_) &
                                                (uint)(fVar37 - filename._M_dataplus._M_p._0_4_) |
                                               (uint)(filename._M_dataplus._M_p._0_4_ - fVar37) &
                                               -(uint)(fVar37 < filename._M_dataplus._M_p._0_4_))) {
LAB_001a8357:
                              __assert_fail("dir.equalWithAbsError (dir1.normalized (), 1e-5f)",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                            ,0xcf,
                                            "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                           );
                            }
                            lVar10 = 1;
                            do {
                              lVar20 = lVar10;
                              if (lVar20 == 3) goto LAB_001a4f4b;
                              fVar37 = *(float *)((long)&filename._M_dataplus._M_p + lVar20 * 4);
                              fVar54 = (float)(&r9.n)[lVar20];
                              lVar10 = lVar20 + 1;
                            } while ((float)(~-(uint)(fVar54 < fVar37) & (uint)(fVar54 - fVar37) |
                                            (uint)(fVar37 - fVar54) & -(uint)(fVar54 < fVar37)) <=
                                     1e-05);
                            if (lVar20 - 1U < 2) goto LAB_001a8357;
LAB_001a4f4b:
                            iVar7 = iVar7 + 1;
                          } while (iVar7 != 0x2f760);
                          iVar7 = Imf_3_2::globalThreadCount();
                          Imf_3_2::RgbaOutputFile::RgbaOutputFile
                                    ((RgbaOutputFile *)&filename,(char *)pfVar12,(Header *)&M1,
                                     WRITE_RGB,iVar7);
                          Imf_3_2::RgbaOutputFile::setFrameBuffer
                                    ((Rgba *)&filename,(ulong)pvVar14,1);
                          Imf_3_2::RgbaOutputFile::writePixels((int)&filename);
                          Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&filename);
                          remove(local_460);
                          remove((char *)pfVar12);
                          operator_delete__(pvVar14);
                          Imf_3_2::Header::~Header((Header *)&M1);
                          if (_c != &local_4a0) {
                            operator_delete(_c,CONCAT44(fStack_49c,local_4a0) + 1);
                          }
                          if ((float (*) [4])M2.x[0]._0_8_ != M2.x + 1) {
                            operator_delete((void *)M2.x[0]._0_8_,M2.x[1]._0_8_ + 1);
                          }
                          M2.x[0]._0_8_ = M2.x + 1;
                          pcVar2 = (tempDir->_M_dataplus)._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&M2,pcVar2,pcVar2 + tempDir->_M_string_length);
                          std::__cxx11::string::append((char *)&M2);
                          _c = &local_4a0;
                          pcVar2 = (tempDir->_M_dataplus)._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&c,pcVar2,pcVar2 + tempDir->_M_string_length);
                          std::__cxx11::string::append((char *)&c);
                          local_370 = (char *)M2.x[0]._0_8_;
                          local_378 = _c;
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"cube environment map",0x14);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
                          std::ostream::put('X');
                          std::ostream::flush();
                          filename._M_dataplus._M_p = (pointer)0x0;
                          Imf_3_2::Header::Header
                                    ((Header *)&M1,0x80,0x300,1.0,(Vec2 *)&filename,1.0,INCREASING_Y
                                     ,ZIP_COMPRESSION);
                          filename._M_dataplus._M_p._0_4_ = 1.4013e-45;
                          Imf_3_2::addEnvmap((Header *)&M1,(Envmap *)&filename);
                          pBVar16 = (Box *)Imf_3_2::Header::dataWindow();
                          iVar7 = Imf_3_2::CubeMap::sizeOfFace(pBVar16);
                          if (iVar7 != 0x80) {
                            __assert_fail("sof == N",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0xe9,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                          pBVar16 = (Box *)0x0;
                          do {
                            Imf_3_2::Header::dataWindow();
                            Imf_3_2::CubeMap::dataWindowForFace((CubeMapFace)&filename,pBVar16);
                            if ((int)(float)filename._M_string_length -
                                (int)filename._M_dataplus._M_p._0_4_ != 0x7f) {
                              __assert_fail("dw1.max.x - dw1.min.x == sof - 1",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                            ,0xf0,
                                            "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                           );
                            }
                            if (filename._M_string_length._4_4_ -
                                (int)filename._M_dataplus._M_p._4_4_ != 0x7f) {
                              __assert_fail("dw1.max.y - dw1.min.y == sof - 1",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                            ,0xf1,
                                            "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                           );
                            }
                            piVar17 = (int *)Imf_3_2::Header::dataWindow();
                            if (((((int)filename._M_dataplus._M_p._0_4_ < *piVar17) ||
                                 (piVar17[2] < (int)filename._M_dataplus._M_p._0_4_)) ||
                                ((int)filename._M_dataplus._M_p._4_4_ < piVar17[1])) ||
                               (piVar17[3] < (int)filename._M_dataplus._M_p._4_4_)) {
                              __assert_fail("header.dataWindow ().intersects (dw1.min)",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                            ,0xf2,
                                            "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                           );
                            }
                            piVar17 = (int *)Imf_3_2::Header::dataWindow();
                            if ((((int)(float)filename._M_string_length < *piVar17) ||
                                (piVar17[2] < (int)(float)filename._M_string_length)) ||
                               ((filename._M_string_length._4_4_ < piVar17[1] ||
                                (piVar17[3] < filename._M_string_length._4_4_)))) {
                              __assert_fail("header.dataWindow ().intersects (dw1.max)",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                            ,0xf3,
                                            "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                           );
                            }
                            uVar22 = (uint)pBVar16 + 1;
                            uVar19 = uVar22;
                            if ((uint)pBVar16 < 5) {
                              do {
                                Imf_3_2::Header::dataWindow();
                                Imf_3_2::CubeMap::dataWindowForFace
                                          ((CubeMapFace)&out,(Box *)(ulong)uVar19);
                                if ((((int)_out <= (int)(float)filename._M_string_length) &&
                                    ((int)filename._M_dataplus._M_p._0_4_ <= (int)fVar74)) &&
                                   (((int)fStack_4cc <= filename._M_string_length._4_4_ &&
                                    ((int)filename._M_dataplus._M_p._4_4_ <= local_4c4)))) {
                                  __assert_fail("!dw1.intersects (dw2)",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0xf9,
                                                "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                               );
                                }
                                uVar19 = uVar19 + 1;
                              } while (uVar19 != 6);
                            }
                            pBVar16 = (Box *)(ulong)uVar22;
                          } while (uVar22 != 6);
                          filename._M_dataplus._M_p = (pointer)0x3f800000;
                          filename._M_string_length._0_4_ = 0.0;
                          pBVar16 = (Box *)Imf_3_2::Header::dataWindow();
                          Imf_3_2::CubeMap::faceAndPixelPosition
                                    ((Vec3 *)&filename,pBVar16,&face,(Vec2 *)&pos);
                          if (face != CUBEFACE_POS_X) {
                            __assert_fail("face == CUBEFACE_POS_X",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x103,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                          if ((0.000128 <
                               (float)(-(uint)(63.5 < pos.x) & (uint)(pos.x + -63.5) |
                                      ~-(uint)(63.5 < pos.x) & (uint)(63.5 - pos.x))) ||
                             (0.000128 <
                              (float)(-(uint)(63.5 < pos.y) & (uint)(pos.y + -63.5) |
                                     ~-(uint)(63.5 < pos.y) & (uint)(63.5 - pos.y)))) {
                            __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x104,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                          filename._M_dataplus._M_p = (pointer)0xbf800000;
                          filename._M_string_length._0_4_ = 0.0;
                          pBVar16 = (Box *)Imf_3_2::Header::dataWindow();
                          Imf_3_2::CubeMap::faceAndPixelPosition
                                    ((Vec3 *)&filename,pBVar16,&face,(Vec2 *)&pos);
                          if (face != CUBEFACE_NEG_X) {
                            __assert_fail("face == CUBEFACE_NEG_X",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x109,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                          if ((0.000128 <
                               (float)(-(uint)(63.5 < pos.x) & (uint)(pos.x + -63.5) |
                                      ~-(uint)(63.5 < pos.x) & (uint)(63.5 - pos.x))) ||
                             (0.000128 <
                              (float)(-(uint)(63.5 < pos.y) & (uint)(pos.y + -63.5) |
                                     ~-(uint)(63.5 < pos.y) & (uint)(63.5 - pos.y)))) {
                            __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x10a,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                          filename._M_dataplus._M_p = (pointer)0x3f80000000000000;
                          filename._M_string_length._0_4_ = 0.0;
                          pBVar16 = (Box *)Imf_3_2::Header::dataWindow();
                          Imf_3_2::CubeMap::faceAndPixelPosition
                                    ((Vec3 *)&filename,pBVar16,&face,(Vec2 *)&pos);
                          if (face != CUBEFACE_POS_Y) {
                            __assert_fail("face == CUBEFACE_POS_Y",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x10f,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                          if ((0.000128 <
                               (float)(-(uint)(63.5 < pos.x) & (uint)(pos.x + -63.5) |
                                      ~-(uint)(63.5 < pos.x) & (uint)(63.5 - pos.x))) ||
                             (0.000128 <
                              (float)(-(uint)(63.5 < pos.y) & (uint)(pos.y + -63.5) |
                                     ~-(uint)(63.5 < pos.y) & (uint)(63.5 - pos.y)))) {
                            __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x110,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                          filename._M_dataplus._M_p = (pointer)0xbf80000000000000;
                          filename._M_string_length._0_4_ = 0.0;
                          pBVar16 = (Box *)Imf_3_2::Header::dataWindow();
                          Imf_3_2::CubeMap::faceAndPixelPosition
                                    ((Vec3 *)&filename,pBVar16,&face,(Vec2 *)&pos);
                          if (face != CUBEFACE_NEG_Y) {
                            __assert_fail("face == CUBEFACE_NEG_Y",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x115,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                          if ((0.000128 <
                               (float)(-(uint)(63.5 < pos.x) & (uint)(pos.x + -63.5) |
                                      ~-(uint)(63.5 < pos.x) & (uint)(63.5 - pos.x))) ||
                             (0.000128 <
                              (float)(-(uint)(63.5 < pos.y) & (uint)(pos.y + -63.5) |
                                     ~-(uint)(63.5 < pos.y) & (uint)(63.5 - pos.y)))) {
                            __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x116,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                          filename._M_dataplus._M_p = (pointer)0x0;
                          filename._M_string_length._0_4_ = 1.0;
                          pBVar16 = (Box *)Imf_3_2::Header::dataWindow();
                          Imf_3_2::CubeMap::faceAndPixelPosition
                                    ((Vec3 *)&filename,pBVar16,&face,(Vec2 *)&pos);
                          if (face != CUBEFACE_POS_Z) {
                            __assert_fail("face == CUBEFACE_POS_Z",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x11b,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                          if ((0.000128 <
                               (float)(-(uint)(63.5 < pos.x) & (uint)(pos.x + -63.5) |
                                      ~-(uint)(63.5 < pos.x) & (uint)(63.5 - pos.x))) ||
                             (0.000128 <
                              (float)(-(uint)(63.5 < pos.y) & (uint)(pos.y + -63.5) |
                                     ~-(uint)(63.5 < pos.y) & (uint)(63.5 - pos.y)))) {
                            __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x11c,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                          filename._M_dataplus._M_p = (pointer)0x0;
                          filename._M_string_length._0_4_ = -1.0;
                          pBVar16 = (Box *)Imf_3_2::Header::dataWindow();
                          Imf_3_2::CubeMap::faceAndPixelPosition
                                    ((Vec3 *)&filename,pBVar16,&face,(Vec2 *)&pos);
                          if (face != CUBEFACE_NEG_Z) {
                            __assert_fail("face == CUBEFACE_NEG_Z",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x121,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                          if ((0.000128 <
                               (float)(-(uint)(63.5 < pos.x) & (uint)(pos.x + -63.5) |
                                      ~-(uint)(63.5 < pos.x) & (uint)(63.5 - pos.x))) ||
                             (0.000128 <
                              (float)(-(uint)(63.5 < pos.y) & (uint)(pos.y + -63.5) |
                                     ~-(uint)(63.5 < pos.y) & (uint)(63.5 - pos.y)))) {
                            __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                          ,0x122,
                                          "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                         );
                          }
                          local_3e8 = operator_new__(0xc0000);
                          lVar10 = (long)local_3e8 + 4;
                          lVar20 = 0;
                          do {
                            lVar21 = 0;
                            do {
                              *(undefined2 *)(lVar10 + lVar21 * 8) = 0;
                              *(undefined4 *)(lVar10 + -4 + lVar21 * 8) = 0;
                              lVar21 = lVar21 + 1;
                            } while (lVar21 != 0x80);
                            lVar20 = lVar20 + 1;
                            lVar10 = lVar10 + 0x400;
                          } while (lVar20 != 0x300);
                          uVar19 = 0;
                          do {
                            fVar37 = 0.0;
                            do {
                              local_388[0] = fVar37;
                              iVar7 = 0;
                              do {
                                uVar18 = Imf_3_2::Header::dataWindow();
                                stack0xfffffffffffffc04 = (float)(int)fVar37;
                                rand._state._0_4_ = (float)iVar7;
                                Imf_3_2::CubeMap::pixelPosition(&out,uVar19,uVar18,&rand);
                                fVar36 = fStack_4cc;
                                local_460 = (char *)(double)_out;
                                pVVar13 = (Vec2 *)Imf_3_2::Header::dataWindow();
                                r9.d = (uint)(float)(int)fVar37;
                                r9.n = (int)(float)iVar7;
                                Imf_3_2::CubeMap::direction
                                          ((CubeMapFace)&filename,(Box *)(ulong)uVar19,pVVar13);
                                fVar54 = (float)filename._M_string_length;
                                _Var63 = filename._M_dataplus;
                                auVar66._8_8_ = 0;
                                auVar66._0_8_ = filename._M_dataplus._M_p;
                                fVar24 = (float)((ulong)filename._M_dataplus._M_p >> 0x20);
                                fVar24 = (float)filename._M_string_length *
                                         (float)filename._M_string_length +
                                         SUB84(filename._M_dataplus._M_p,0) *
                                         SUB84(filename._M_dataplus._M_p,0) + fVar24 * fVar24;
                                if (fVar24 < 2.3509887e-38) {
                                  testStandardAttributes();
                                  if ((extraout_RAX & 1) == 0) {
                                    fVar24 = (float)r9.n;
                                    goto LAB_001a5933;
                                  }
                                }
                                else {
                                  fVar24 = SQRT(fVar24);
LAB_001a5933:
                                  if ((fVar24 != 0.0) || (NAN(fVar24))) {
                                    fVar54 = fVar54 / fVar24;
                                    auVar34._4_4_ = fVar24;
                                    auVar34._0_4_ = fVar24;
                                    auVar34._8_4_ = fVar24;
                                    auVar34._12_4_ = fVar24;
                                    auVar70 = divps(auVar66,auVar34);
                                    _Var63._M_p = auVar70._0_8_;
                                  }
                                }
                                fVar67 = SUB84(_Var63._M_p,0) + 1.0;
                                fVar24 = ABS(fVar67);
                                uVar6 = (ushort)((uint)fVar67 >> 0x10) & 0x8000;
                                if ((uint)fVar24 < 0x38800000) {
                                  if ((0x33000000 < (uint)fVar24) &&
                                     (uVar22 = (uint)fVar24 & 0x7fffff | 0x800000,
                                     cVar5 = (char)((uint)fVar24 >> 0x17),
                                     uVar6 = uVar6 | (ushort)(uVar22 >> (0x7eU - cVar5 & 0x1f)),
                                     0x80000000 < uVar22 << (cVar5 + 0xa2U & 0x1f))) {
                                    uVar6 = uVar6 + 1;
                                  }
                                }
                                else if ((uint)fVar24 < 0x7f800000) {
                                  if ((uint)fVar24 < 0x477ff000) {
                                    uVar6 = (ushort)((int)fVar24 + 0x8000fff +
                                                     (uint)(((uint)fVar24 >> 0xd & 1) != 0) >> 0xd)
                                            | uVar6;
                                  }
                                  else {
                                    uVar6 = uVar6 | 0x7c00;
                                  }
                                }
                                else {
                                  uVar6 = uVar6 | 0x7c00;
                                  if (fVar24 != INFINITY) {
                                    uVar22 = (uint)fVar24 >> 0xd & 0x3ff;
                                    uVar6 = uVar6 | (ushort)uVar22 | (ushort)(uVar22 == 0);
                                  }
                                }
                                iVar23 = (int)(fVar36 + 0.5);
                                lVar10 = (long)(int)((double)local_460 + 0.5);
                                *(ushort *)((long)local_3e8 + lVar10 * 8 + (long)iVar23 * 0x400) =
                                     uVar6;
                                fVar24 = (float)((ulong)_Var63._M_p >> 0x20) + 1.0;
                                fVar36 = ABS(fVar24);
                                uVar6 = (ushort)((uint)fVar24 >> 0x10) & 0x8000;
                                if ((uint)fVar36 < 0x38800000) {
                                  if ((0x33000000 < (uint)fVar36) &&
                                     (uVar22 = (uint)fVar36 & 0x7fffff | 0x800000,
                                     cVar5 = (char)((uint)fVar36 >> 0x17),
                                     uVar6 = uVar6 | (ushort)(uVar22 >> (0x7eU - cVar5 & 0x1f)),
                                     0x80000000 < uVar22 << (cVar5 + 0xa2U & 0x1f))) {
                                    uVar6 = uVar6 + 1;
                                  }
                                }
                                else if ((uint)fVar36 < 0x7f800000) {
                                  if ((uint)fVar36 < 0x477ff000) {
                                    uVar6 = (ushort)((int)fVar36 + 0x8000fff +
                                                     (uint)(((uint)fVar36 >> 0xd & 1) != 0) >> 0xd)
                                            | uVar6;
                                  }
                                  else {
                                    uVar6 = uVar6 | 0x7c00;
                                  }
                                }
                                else {
                                  uVar6 = uVar6 | 0x7c00;
                                  if (fVar36 != INFINITY) {
                                    uVar22 = (uint)fVar36 >> 0xd & 0x3ff;
                                    uVar6 = uVar6 | (ushort)uVar22 | (ushort)(uVar22 == 0);
                                  }
                                }
                                *(ushort *)((long)local_3e8 + lVar10 * 8 + (long)iVar23 * 0x400 + 2)
                                     = uVar6;
                                fVar36 = ABS(fVar54 + 1.0);
                                uVar6 = (ushort)((uint)(fVar54 + 1.0) >> 0x10) & 0x8000;
                                if ((uint)fVar36 < 0x38800000) {
                                  if ((0x33000000 < (uint)fVar36) &&
                                     (uVar22 = (uint)fVar36 & 0x7fffff | 0x800000,
                                     cVar5 = (char)((uint)fVar36 >> 0x17),
                                     uVar6 = uVar6 | (ushort)(uVar22 >> (0x7eU - cVar5 & 0x1f)),
                                     0x80000000 < uVar22 << (cVar5 + 0xa2U & 0x1f))) {
                                    uVar6 = uVar6 + 1;
                                  }
                                }
                                else if ((uint)fVar36 < 0x7f800000) {
                                  if ((uint)fVar36 < 0x477ff000) {
                                    uVar6 = (ushort)((int)fVar36 + 0x8000fff +
                                                     (uint)(((uint)fVar36 >> 0xd & 1) != 0) >> 0xd)
                                            | uVar6;
                                  }
                                  else {
                                    uVar6 = uVar6 | 0x7c00;
                                  }
                                }
                                else {
                                  uVar6 = uVar6 | 0x7c00;
                                  if (fVar36 != INFINITY) {
                                    uVar22 = (uint)fVar36 >> 0xd & 0x3ff;
                                    uVar6 = uVar6 | (ushort)uVar22 | (ushort)(uVar22 == 0);
                                  }
                                }
                                *(ushort *)((long)local_3e8 + lVar10 * 8 + (long)iVar23 * 0x400 + 4)
                                     = uVar6;
                                iVar7 = iVar7 + 1;
                              } while (iVar7 != 0x80);
                              fVar37 = (float)((int)local_388[0] + 1);
                            } while (fVar37 != 1.79366e-43);
                            uVar19 = uVar19 + 1;
                          } while (uVar19 != 6);
                          iVar7 = Imf_3_2::globalThreadCount();
                          Imf_3_2::RgbaOutputFile::RgbaOutputFile
                                    ((RgbaOutputFile *)&filename,local_370,(Header *)&M1,WRITE_RGB,
                                     iVar7);
                          Imf_3_2::RgbaOutputFile::setFrameBuffer
                                    ((Rgba *)&filename,(ulong)local_3e8,1);
                          Imf_3_2::RgbaOutputFile::writePixels((int)&filename);
                          Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&filename);
                          lVar10 = (long)local_3e8 + 4;
                          lVar20 = 0;
                          do {
                            lVar21 = 0;
                            do {
                              if ((((*(float *)(_imath_half_to_float_table +
                                               (ulong)*(ushort *)(lVar10 + -4 + lVar21 * 8) * 4) ==
                                     0.0) && (fVar37 = *(float *)(_imath_half_to_float_table +
                                                                 (ulong)*(ushort *)
                                                                         (lVar10 + -2 + lVar21 * 8)
                                                                 * 4), fVar37 == 0.0)) &&
                                  (!NAN(fVar37))) &&
                                 ((fVar37 = *(float *)(_imath_half_to_float_table +
                                                      (ulong)*(ushort *)(lVar10 + lVar21 * 8) * 4),
                                  fVar37 == 0.0 && (!NAN(fVar37))))) {
                                __assert_fail("p.r != 0 || p.g != 0 || p.b != 0",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x150,
                                              "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                             );
                              }
                              lVar21 = lVar21 + 1;
                            } while (lVar21 != 0x80);
                            lVar20 = lVar20 + 1;
                            lVar10 = lVar10 + 0x400;
                          } while (lVar20 != 0x300);
                          _rand_1 = CONCAT26(uStack_40a,0x5a5a5a5a5a5a);
                          iVar7 = 0;
                          while( true ) {
                            Imath_3_2::hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
                                      ((Imath_3_2 *)&filename,&rand_1);
                            pBVar16 = (Box *)Imf_3_2::Header::dataWindow();
                            Imf_3_2::CubeMap::faceAndPixelPosition
                                      ((Vec3 *)&filename,pBVar16,&face_2,(Vec2 *)&pif);
                            VVar4 = _face_2;
                            uVar18 = Imf_3_2::Header::dataWindow();
                            local_3b8.x = pif.x;
                            local_3b8.y = pif.y;
                            Imf_3_2::CubeMap::pixelPosition
                                      (&pos_2,(ulong)VVar4 & 0xffffffff,uVar18,&local_3b8);
                            VVar4 = _face_2;
                            fVar37 = (filename._M_dataplus._M_p._0_4_ + 1.0) * 0.8;
                            fVar54 = ABS(fVar37);
                            uVar6 = (ushort)((uint)fVar37 >> 0x10) & 0x8000;
                            if ((uint)fVar54 < 0x38800000) {
                              if ((0x33000000 < (uint)fVar54) &&
                                 (uVar19 = (uint)fVar54 & 0x7fffff | 0x800000,
                                 cVar5 = (char)((uint)fVar54 >> 0x17),
                                 uVar6 = uVar6 | (ushort)(uVar19 >> (0x7eU - cVar5 & 0x1f)),
                                 0x80000000 < uVar19 << (cVar5 + 0xa2U & 0x1f))) {
                                uVar6 = uVar6 + 1;
                              }
                            }
                            else if ((uint)fVar54 < 0x7f800000) {
                              if ((uint)fVar54 < 0x477ff000) {
                                uVar6 = (ushort)((int)fVar54 + 0x8000fff +
                                                 (uint)(((uint)fVar54 >> 0xd & 1) != 0) >> 0xd) |
                                        uVar6;
                              }
                              else {
                                uVar6 = uVar6 | 0x7c00;
                              }
                            }
                            else {
                              uVar6 = uVar6 | 0x7c00;
                              if (fVar54 != INFINITY) {
                                uVar19 = (uint)fVar54 >> 0xd & 0x3ff;
                                uVar6 = uVar6 | (ushort)uVar19 | (ushort)(uVar19 == 0);
                              }
                            }
                            iVar23 = (int)(pos_2.y + 0.5);
                            lVar10 = (long)(int)(pos_2.x + 0.5);
                            *(ushort *)((long)local_3e8 + lVar10 * 8 + (long)iVar23 * 0x400) = uVar6
                            ;
                            fVar37 = (filename._M_dataplus._M_p._4_4_ + 1.0) * 0.8;
                            fVar54 = ABS(fVar37);
                            uVar6 = (ushort)((uint)fVar37 >> 0x10) & 0x8000;
                            if ((uint)fVar54 < 0x38800000) {
                              if ((0x33000000 < (uint)fVar54) &&
                                 (uVar19 = (uint)fVar54 & 0x7fffff | 0x800000,
                                 cVar5 = (char)((uint)fVar54 >> 0x17),
                                 uVar6 = uVar6 | (ushort)(uVar19 >> (0x7eU - cVar5 & 0x1f)),
                                 0x80000000 < uVar19 << (cVar5 + 0xa2U & 0x1f))) {
                                uVar6 = uVar6 + 1;
                              }
                            }
                            else if ((uint)fVar54 < 0x7f800000) {
                              if ((uint)fVar54 < 0x477ff000) {
                                uVar6 = (ushort)((int)fVar54 + 0x8000fff +
                                                 (uint)(((uint)fVar54 >> 0xd & 1) != 0) >> 0xd) |
                                        uVar6;
                              }
                              else {
                                uVar6 = uVar6 | 0x7c00;
                              }
                            }
                            else {
                              uVar6 = uVar6 | 0x7c00;
                              if (fVar54 != INFINITY) {
                                uVar19 = (uint)fVar54 >> 0xd & 0x3ff;
                                uVar6 = uVar6 | (ushort)uVar19 | (ushort)(uVar19 == 0);
                              }
                            }
                            *(ushort *)((long)local_3e8 + lVar10 * 8 + (long)iVar23 * 0x400 + 2) =
                                 uVar6;
                            fVar37 = ((float)filename._M_string_length + 1.0) * 0.8;
                            fVar54 = ABS(fVar37);
                            uVar6 = (ushort)((uint)fVar37 >> 0x10) & 0x8000;
                            if ((uint)fVar54 < 0x38800000) {
                              if ((0x33000000 < (uint)fVar54) &&
                                 (uVar19 = (uint)fVar54 & 0x7fffff | 0x800000,
                                 cVar5 = (char)((uint)fVar54 >> 0x17),
                                 uVar6 = uVar6 | (ushort)(uVar19 >> (0x7eU - cVar5 & 0x1f)),
                                 0x80000000 < uVar19 << (cVar5 + 0xa2U & 0x1f))) {
                                uVar6 = uVar6 + 1;
                              }
                            }
                            else if ((uint)fVar54 < 0x7f800000) {
                              if ((uint)fVar54 < 0x477ff000) {
                                uVar6 = (ushort)((int)fVar54 + 0x8000fff +
                                                 (uint)(((uint)fVar54 >> 0xd & 1) != 0) >> 0xd) |
                                        uVar6;
                              }
                              else {
                                uVar6 = uVar6 | 0x7c00;
                              }
                            }
                            else {
                              uVar6 = uVar6 | 0x7c00;
                              if (fVar54 != INFINITY) {
                                uVar19 = (uint)fVar54 >> 0xd & 0x3ff;
                                uVar6 = uVar6 | (ushort)uVar19 | (ushort)(uVar19 == 0);
                              }
                            }
                            *(ushort *)((long)local_3e8 + lVar10 * 8 + (long)iVar23 * 0x400 + 4) =
                                 uVar6;
                            pVVar13 = (Vec2 *)Imf_3_2::Header::dataWindow();
                            Imf_3_2::CubeMap::direction
                                      ((CubeMapFace)&out,(Box *)((ulong)VVar4 & 0xffffffff),pVVar13)
                            ;
                            fVar37 = fVar74 * fVar74 + _out * _out + fStack_4cc * fStack_4cc;
                            if (fVar37 < 2.3509887e-38) {
                              fVar37 = Imath_3_2::Vec3<float>::lengthTiny((Vec3<float> *)&out);
                            }
                            else {
                              fVar37 = SQRT(fVar37);
                            }
                            if ((fVar37 != 0.0) || (NAN(fVar37))) {
                              auVar53._8_8_ = 0;
                              auVar53._0_2_ = _out;
                              auVar53._2_2_ = hStack_4ce._h;
                              auVar53._4_2_ = fStack_4cc._0_2_;
                              auVar53._6_2_ = fStack_4cc._2_2_;
                              auVar61._4_4_ = fVar37;
                              auVar61._0_4_ = fVar37;
                              auVar61._8_4_ = fVar37;
                              auVar61._12_4_ = fVar37;
                              auVar70 = divps(auVar53,auVar61);
                              r9 = auVar70._0_8_;
                            }
                            else {
                              r9.n = 0;
                              r9.d = 0;
                            }
                            fVar37 = (float)r9.n;
                            if (1e-06 < (float)(~-(uint)(fVar37 < filename._M_dataplus._M_p._0_4_) &
                                                (uint)(fVar37 - filename._M_dataplus._M_p._0_4_) |
                                               (uint)(filename._M_dataplus._M_p._0_4_ - fVar37) &
                                               -(uint)(fVar37 < filename._M_dataplus._M_p._0_4_)))
                            break;
                            lVar10 = 1;
                            do {
                              lVar20 = lVar10;
                              if (lVar20 == 3) goto LAB_001a6160;
                              fVar37 = *(float *)((long)&filename._M_dataplus._M_p + lVar20 * 4);
                              fVar54 = (float)(&r9.n)[lVar20];
                              lVar10 = lVar20 + 1;
                            } while ((float)(~-(uint)(fVar54 < fVar37) & (uint)(fVar54 - fVar37) |
                                            (uint)(fVar37 - fVar54) & -(uint)(fVar54 < fVar37)) <=
                                     1e-06);
                            if (lVar20 - 1U < 2) break;
LAB_001a6160:
                            iVar7 = iVar7 + 1;
                            if (iVar7 == 0x48000) {
                              iVar7 = Imf_3_2::globalThreadCount();
                              Imf_3_2::RgbaOutputFile::RgbaOutputFile
                                        ((RgbaOutputFile *)&filename,(char *)local_378,(Header *)&M1
                                         ,WRITE_RGB,iVar7);
                              Imf_3_2::RgbaOutputFile::setFrameBuffer
                                        ((Rgba *)&filename,(ulong)local_3e8,1);
                              Imf_3_2::RgbaOutputFile::writePixels((int)&filename);
                              Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&filename);
                              remove(local_370);
                              remove((char *)local_378);
                              operator_delete__(local_3e8);
                              Imf_3_2::Header::~Header((Header *)&M1);
                              if (_c != &local_4a0) {
                                operator_delete(_c,CONCAT44(fStack_49c,local_4a0) + 1);
                              }
                              if ((float (*) [4])M2.x[0]._0_8_ != M2.x + 1) {
                                operator_delete((void *)M2.x[0]._0_8_,M2.x[1]._0_8_ + 1);
                              }
                              _c = &local_4a0;
                              pcVar2 = (tempDir->_M_dataplus)._M_p;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)&c,pcVar2,pcVar2 + tempDir->_M_string_length);
                              std::__cxx11::string::append((char *)&c);
                              pfVar12 = _c;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,"key code attribute",0x12);
                              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
                              std::ostream::put('X');
                              std::ostream::flush();
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,"writing, ",9);
                              Imf_3_2::KeyCode::KeyCode
                                        ((KeyCode *)&filename,0xc,0x22,0x1e240,0x4d2,0x2d,3,0x50);
                              iVar7 = Imf_3_2::KeyCode::filmMfcCode();
                              if (iVar7 != 0xc) {
                                __assert_fail("k1.filmMfcCode () == 12",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x185,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::filmType();
                              if (iVar7 != 0x22) {
                                __assert_fail("k1.filmType () == 34",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x186,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::prefix();
                              if (iVar7 != 0x1e240) {
                                __assert_fail("k1.prefix () == 123456",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x187,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::count();
                              if (iVar7 != 0x4d2) {
                                __assert_fail("k1.count () == 1234",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x188,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::perfOffset();
                              if (iVar7 != 0x2d) {
                                __assert_fail("k1.perfOffset () == 45",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x189,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::perfsPerFrame();
                              if (iVar7 != 3) {
                                __assert_fail("k1.perfsPerFrame () == 3",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x18a,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::perfsPerCount();
                              if (iVar7 != 0x50) {
                                __assert_fail("k1.perfsPerCount () == 80",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x18b,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              M1.x[0][0] = 0.0;
                              M1.x[0][1] = 0.0;
                              Imf_3_2::Header::Header
                                        ((Header *)&M2,100,100,1.0,(Vec2 *)&M1,1.0,INCREASING_Y,
                                         ZIP_COMPRESSION);
                              cVar5 = Imf_3_2::hasKeyCode((Header *)&M2);
                              if (cVar5 != '\0') {
                                __assert_fail("hasKeyCode (header) == false",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x191,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              Imf_3_2::addKeyCode((Header *)&M2,(KeyCode *)&filename);
                              cVar5 = Imf_3_2::hasKeyCode((Header *)&M2);
                              if (cVar5 == '\0') {
                                __assert_fail("hasKeyCode (header) == true",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x194,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::globalThreadCount();
                              Imf_3_2::RgbaOutputFile::RgbaOutputFile
                                        (&out,(char *)pfVar12,(Header *)&M2,WRITE_RGBA,iVar7);
                              lVar10 = 0;
                              do {
                                pfVar1 = M1.x[0] + lVar10 * 2;
                                pfVar1[0] = 0.007826805;
                                pfVar1[1] = 0.007826805;
                                lVar10 = lVar10 + 1;
                              } while (lVar10 != 100);
                              Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)&M1,1);
                              Imf_3_2::RgbaOutputFile::writePixels((int)&out);
                              Imf_3_2::RgbaOutputFile::~RgbaOutputFile(&out);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,"reading, comparing",0x12);
                              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
                              std::ostream::put('X');
                              std::ostream::flush();
                              iVar7 = Imf_3_2::globalThreadCount();
                              Imf_3_2::RgbaInputFile::RgbaInputFile
                                        ((RgbaInputFile *)&M1,(char *)pfVar12,iVar7);
                              pHVar11 = (Header *)Imf_3_2::RgbaInputFile::header();
                              Imf_3_2::keyCode(pHVar11);
                              pHVar11 = (Header *)Imf_3_2::RgbaInputFile::header();
                              cVar5 = Imf_3_2::hasKeyCode(pHVar11);
                              if (cVar5 == '\0') {
                                __assert_fail("hasKeyCode (in.header ()) == true",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1ac,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::filmMfcCode();
                              iVar23 = Imf_3_2::KeyCode::filmMfcCode();
                              if (iVar7 != iVar23) {
                                __assert_fail("k1.filmMfcCode () == k2.filmMfcCode ()",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1ad,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::filmType();
                              iVar23 = Imf_3_2::KeyCode::filmType();
                              if (iVar7 != iVar23) {
                                __assert_fail("k1.filmType () == k2.filmType ()",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1ae,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::prefix();
                              iVar23 = Imf_3_2::KeyCode::prefix();
                              if (iVar7 != iVar23) {
                                __assert_fail("k1.prefix () == k2.prefix ()",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1af,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::count();
                              iVar23 = Imf_3_2::KeyCode::count();
                              if (iVar7 != iVar23) {
                                __assert_fail("k1.count () == k2.count ()",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1b0,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::perfOffset();
                              iVar23 = Imf_3_2::KeyCode::perfOffset();
                              if (iVar7 != iVar23) {
                                __assert_fail("k1.perfOffset () == k2.perfOffset ()",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1b1,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::perfsPerFrame();
                              iVar23 = Imf_3_2::KeyCode::perfsPerFrame();
                              if (iVar7 != iVar23) {
                                __assert_fail("k1.perfsPerFrame () == k2.perfsPerFrame ()",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1b2,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::perfsPerCount();
                              iVar23 = Imf_3_2::KeyCode::perfsPerCount();
                              if (iVar7 != iVar23) {
                                __assert_fail("k1.perfsPerCount () == k2.perfsPerCount ()",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1b3,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&M1);
                              remove((char *)pfVar12);
                              Imf_3_2::Header::~Header((Header *)&M2);
                              if (_c != &local_4a0) {
                                operator_delete(_c,CONCAT44(fStack_49c,local_4a0) + 1);
                              }
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,"time code methods",0x11);
                              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
                              std::ostream::put('X');
                              std::ostream::flush();
                              Imf_3_2::TimeCode::TimeCode((TimeCode *)&M1);
                              iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                              if (iVar7 != 0) {
                                __assert_fail("t.timeAndFlags () == 0",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1c0,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              iVar7 = Imf_3_2::TimeCode::userData();
                              if (iVar7 != 0) {
                                __assert_fail("t.userData () == 0",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1c1,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,TV60_PACKING);
                              Imf_3_2::TimeCode::setFrame((int)&M1);
                              iVar7 = Imf_3_2::TimeCode::frame();
                              if (iVar7 != 0x1d) {
                                __assert_fail("t.frame () == 29",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1c7,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                              if (iVar7 != 0x29) {
                                __assert_fail("t.timeAndFlags () == 0x00000029",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1c8,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,~TV60_PACKING);
                              Imf_3_2::TimeCode::setFrame((int)&M1);
                              iVar7 = Imf_3_2::TimeCode::frame();
                              if (iVar7 != 0) {
                                __assert_fail("t.frame () == 0",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1cc,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                              if (iVar7 != -0x40) {
                                __assert_fail("t.timeAndFlags () == 0xffffffc0",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1cd,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,TV60_PACKING);
                              Imf_3_2::TimeCode::setSeconds((int)&M1);
                              iVar7 = Imf_3_2::TimeCode::seconds();
                              if (iVar7 != 0x3b) {
                                __assert_fail("t.seconds () == 59",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1d3,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                              if (iVar7 != 0x5900) {
                                __assert_fail("t.timeAndFlags () == 0x00005900",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1d4,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,~TV60_PACKING);
                              Imf_3_2::TimeCode::setSeconds((int)&M1);
                              iVar7 = Imf_3_2::TimeCode::seconds();
                              if (iVar7 != 0) {
                                __assert_fail("t.seconds () == 0",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1d8,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                              if (iVar7 != -0x7f01) {
                                __assert_fail("t.timeAndFlags () == 0xffff80ff",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1d9,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,TV60_PACKING);
                              Imf_3_2::TimeCode::setMinutes((int)&M1);
                              iVar7 = Imf_3_2::TimeCode::minutes();
                              if (iVar7 != 0x3b) {
                                __assert_fail("t.minutes () == 59",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1df,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                              if (iVar7 != 0x590000) {
                                __assert_fail("t.timeAndFlags () == 0x00590000",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1e0,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,~TV60_PACKING);
                              Imf_3_2::TimeCode::setMinutes((int)&M1);
                              iVar7 = Imf_3_2::TimeCode::minutes();
                              if (iVar7 != 0) {
                                __assert_fail("t.minutes () == 0",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1e4,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                              if (iVar7 != -0x7f0001) {
                                __assert_fail("t.timeAndFlags () == 0xff80ffff",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1e5,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,TV60_PACKING);
                              Imf_3_2::TimeCode::setHours((int)&M1);
                              iVar7 = Imf_3_2::TimeCode::hours();
                              if (iVar7 != 0x17) {
                                __assert_fail("t.hours () == 23",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1eb,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                              if (iVar7 != 0x23000000) {
                                __assert_fail("t.timeAndFlags () == 0x23000000",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1ec,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,~TV60_PACKING);
                              Imf_3_2::TimeCode::setHours((int)&M1);
                              iVar7 = Imf_3_2::TimeCode::hours();
                              if (iVar7 != 0) {
                                __assert_fail("t.hours () == 0",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1f0,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                              if (iVar7 != -0x3f000001) {
                                __assert_fail("t.timeAndFlags () == 0xc0ffffff",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1f1,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,TV60_PACKING);
                              Imf_3_2::TimeCode::setDropFrame(SUB81(&M1,0));
                              cVar5 = Imf_3_2::TimeCode::dropFrame();
                              if (cVar5 == '\0') {
                                __assert_fail("t.dropFrame () == true",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1f7,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                              if (iVar7 != 0x40) {
                                __assert_fail("t.timeAndFlags () == 0x00000040",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1f8,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,~TV60_PACKING);
                              Imf_3_2::TimeCode::setDropFrame(SUB81(&M1,0));
                              cVar5 = Imf_3_2::TimeCode::dropFrame();
                              if (cVar5 != '\0') {
                                __assert_fail("t.dropFrame () == false",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1fc,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                              if (iVar7 != -0x41) {
                                __assert_fail("t.timeAndFlags () == 0xffffffbf",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1fd,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,TV60_PACKING);
                              Imf_3_2::TimeCode::setColorFrame(SUB81(&M1,0));
                              cVar5 = Imf_3_2::TimeCode::colorFrame();
                              if (cVar5 == '\0') {
                                __assert_fail("t.colorFrame () == true",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x203,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                              if (iVar7 != 0x80) {
                                __assert_fail("t.timeAndFlags () == 0x00000080",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x204,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,~TV60_PACKING);
                              Imf_3_2::TimeCode::setColorFrame(SUB81(&M1,0));
                              cVar5 = Imf_3_2::TimeCode::colorFrame();
                              if (cVar5 != '\0') {
                                __assert_fail("t.colorFrame () == false",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x208,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                              if (iVar7 != -0x81) {
                                __assert_fail("t.timeAndFlags () == 0xffffff7f",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x209,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,TV60_PACKING);
                              Imf_3_2::TimeCode::setFieldPhase(SUB81(&M1,0));
                              cVar5 = Imf_3_2::TimeCode::fieldPhase();
                              if (cVar5 == '\0') {
                                __assert_fail("t.fieldPhase () == true",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x20f,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                              if (iVar7 != 0x8000) {
                                __assert_fail("t.timeAndFlags (TimeCode::TV60_PACKING) == 0x00008000"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x210,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                              __assert_fail("t.timeAndFlags (TimeCode::TV50_PACKING) == 0x80000000",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                            ,0x211,"void (anonymous namespace)::timeCodeMethods()");
                            }
                          }
                          __assert_fail("dir.equalWithAbsError (dir1.normalized (), 1e-6f)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                        ,0x168,
                                        "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                       );
                        }
                      }
                      __assert_fail("c1.red == c2.red",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                    ,0x7a,
                                    "void (anonymous namespace)::writeReadChromaticities(const char *)"
                                   );
                    }
                  }
                  __assert_fail("W2.equalWithAbsError (V3f (1, 1, 1), 1e-3F)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                ,0x4f,"void (anonymous namespace)::convertRGBtoXYZ()");
                }
              }
              __assert_fail("B2.equalWithAbsError (V3f (0, 0, 1), 1e-3F)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                            ,0x4e,"void (anonymous namespace)::convertRGBtoXYZ()");
            }
          }
          __assert_fail("G2.equalWithAbsError (V3f (0, 1, 0), 1e-3F)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                        ,0x4d,"void (anonymous namespace)::convertRGBtoXYZ()");
        }
      }
      __assert_fail("R2.equalWithAbsError (V3f (1, 0, 0), 1e-3F)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                    ,0x4c,"void (anonymous namespace)::convertRGBtoXYZ()");
    }
  }
  __assert_fail("r1.equalWithAbsError (c.red, 1e-5F)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                ,0x39,"void (anonymous namespace)::convertRGBtoXYZ()");
}

Assistant:

void
testStandardAttributes (const std::string& tempDir)
{
    try
    {
        cout << "Testing optional standard attributes" << endl;

        convertRGBtoXYZ ();

        {
            std::string filename = tempDir + "imf_test_chromaticities.exr";
            writeReadChromaticities (filename.c_str ());
        }

        {
            std::string fn1 = tempDir + "imf_test_latlong1.exr";
            std::string fn2 = tempDir + "imf_test_latlong2.exr";
            latLongMap (fn1.c_str (), fn2.c_str ());
        }

        {
            std::string fn1 = tempDir + "imf_test_cube1.exr";
            std::string fn2 = tempDir + "imf_test_cube2.exr";
            cubeMap (fn1.c_str (), fn2.c_str ());
        }

        {
            std::string filename = tempDir + "imf_test_keycode.exr";
            writeReadKeyCode (filename.c_str ());
        }

        {
            timeCodeMethods ();
            std::string filename = tempDir + "imf_test_timecode.exr";
            writeReadTimeCode (filename.c_str ());
        }

        {
            rationalMethods ();
            std::string filename = tempDir + "imf_test_rational.exr";
            writeReadRational (filename.c_str ());
        }

        generatedFunctions ();

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}